

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCCommon.h
# Opt level: O0

void SL::Screen_Capture::
     ProcessCapture<SL::Screen_Capture::CaptureData<std::function<void(SL::Screen_Capture::Image_const&,SL::Screen_Capture::Monitor_const&)>,std::function<void(SL::Screen_Capture::Image_const*,SL::Screen_Capture::MousePoint_const&)>,std::function<std::vector<SL::Screen_Capture::Monitor,std::allocator<SL::Screen_Capture::Monitor>>()>>,SL::Screen_Capture::Monitor>
               (CaptureData<std::function<void_(const_SL::Screen_Capture::Image_&,_const_SL::Screen_Capture::Monitor_&)>,_std::function<void_(const_SL::Screen_Capture::Image_*,_const_SL::Screen_Capture::MousePoint_&)>,_std::function<std::vector<SL::Screen_Capture::Monitor,_std::allocator<SL::Screen_Capture::Monitor>_>_()>_>
                *data,BaseFrameProcessor *base,Monitor *mointor,uchar *startsrc,int srcrowstride)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer __dest;
  void *in_RCX;
  Monitor *in_RDX;
  long in_RSI;
  int in_R8D;
  int i;
  pointer startdst;
  Image difimg;
  uchar *thisstartsrc;
  int leftoffset;
  ImageRect *r;
  iterator __end4;
  iterator __begin4;
  vector<SL::Screen_Capture::ImageRect,_std::allocator<SL::Screen_Capture::ImageRect>_> *__range4;
  vector<SL::Screen_Capture::ImageRect,_std::allocator<SL::Screen_Capture::ImageRect>_> imgdifs;
  Image oldimg;
  Image newimg;
  Image wholeimg_1;
  Image wholeimg;
  int dstrowstride;
  ImageBGRA *startimgsrc;
  int sizeofimgbgra;
  ImageRect imageract;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  Monitor *in_stack_fffffffffffffea0;
  Image *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  int iVar5;
  ImageRect *in_stack_fffffffffffffeb8;
  __normal_iterator<SL::Screen_Capture::ImageRect_*,_std::vector<SL::Screen_Capture::ImageRect,_std::allocator<SL::Screen_Capture::ImageRect>_>_>
  local_f0;
  undefined1 *local_e8;
  undefined1 local_e0 [16];
  Image *in_stack_ffffffffffffff30;
  Image *in_stack_ffffffffffffff38;
  
  ImageRect::ImageRect((ImageRect *)0x14afac);
  Height(in_RDX);
  Width(in_RDX);
  iVar2 = Width(in_RDX);
  iVar2 = iVar2 * 4;
  bVar1 = std::function::operator_cast_to_bool
                    ((function<void_(const_SL::Screen_Capture::Image_&,_const_SL::Screen_Capture::Monitor_&)>
                      *)in_stack_fffffffffffffea0);
  if (bVar1) {
    CreateImage(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                (ImageBGRA *)in_stack_fffffffffffffea8);
    std::function<void_(const_SL::Screen_Capture::Image_&,_const_SL::Screen_Capture::Monitor_&)>::
    operator()((function<void_(const_SL::Screen_Capture::Image_&,_const_SL::Screen_Capture::Monitor_&)>
                *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  }
  bVar1 = std::function::operator_cast_to_bool
                    ((function<void_(const_SL::Screen_Capture::Image_&,_const_SL::Screen_Capture::Monitor_&)>
                      *)in_stack_fffffffffffffea0);
  if (bVar1) {
    if ((*(byte *)(in_RSI + 0x1c) & 1) == 0) {
      CreateImage(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                  (ImageBGRA *)in_stack_fffffffffffffea8);
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                 in_stack_fffffffffffffea0);
      CreateImage(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                  (ImageBGRA *)in_stack_fffffffffffffea8);
      GetDifs(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      local_e8 = local_e0;
      local_f0._M_current =
           (ImageRect *)
           std::
           vector<SL::Screen_Capture::ImageRect,_std::allocator<SL::Screen_Capture::ImageRect>_>::
           begin((vector<SL::Screen_Capture::ImageRect,_std::allocator<SL::Screen_Capture::ImageRect>_>
                  *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      std::vector<SL::Screen_Capture::ImageRect,_std::allocator<SL::Screen_Capture::ImageRect>_>::
      end((vector<SL::Screen_Capture::ImageRect,_std::allocator<SL::Screen_Capture::ImageRect>_> *)
          CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<SL::Screen_Capture::ImageRect_*,_std::vector<SL::Screen_Capture::ImageRect,_std::allocator<SL::Screen_Capture::ImageRect>_>_>
                                 *)in_stack_fffffffffffffea0,
                                (__normal_iterator<SL::Screen_Capture::ImageRect_*,_std::vector<SL::Screen_Capture::ImageRect,_std::allocator<SL::Screen_Capture::ImageRect>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)),
            bVar1) {
        __gnu_cxx::
        __normal_iterator<SL::Screen_Capture::ImageRect_*,_std::vector<SL::Screen_Capture::ImageRect,_std::allocator<SL::Screen_Capture::ImageRect>_>_>
        ::operator*(&local_f0);
        CreateImage(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                    (ImageBGRA *)in_stack_fffffffffffffea8);
        std::function<void_(const_SL::Screen_Capture::Image_&,_const_SL::Screen_Capture::Monitor_&)>
        ::operator()((function<void_(const_SL::Screen_Capture::Image_&,_const_SL::Screen_Capture::Monitor_&)>
                      *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
        __gnu_cxx::
        __normal_iterator<SL::Screen_Capture::ImageRect_*,_std::vector<SL::Screen_Capture::ImageRect,_std::allocator<SL::Screen_Capture::ImageRect>_>_>
        ::operator++(&local_f0);
      }
      std::vector<SL::Screen_Capture::ImageRect,_std::allocator<SL::Screen_Capture::ImageRect>_>::
      ~vector((vector<SL::Screen_Capture::ImageRect,_std::allocator<SL::Screen_Capture::ImageRect>_>
               *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    }
    else {
      CreateImage(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                  (ImageBGRA *)in_stack_fffffffffffffea8);
      std::function<void_(const_SL::Screen_Capture::Image_&,_const_SL::Screen_Capture::Monitor_&)>::
      operator()((function<void_(const_SL::Screen_Capture::Image_&,_const_SL::Screen_Capture::Monitor_&)>
                  *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                 in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
      *(undefined1 *)(in_RSI + 0x1c) = 0;
    }
    __dest = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                       ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                        in_stack_fffffffffffffea0);
    if (iVar2 == in_R8D) {
      iVar3 = Height(in_RDX);
      memcpy(__dest,in_RCX,(long)(iVar2 * iVar3));
    }
    else {
      iVar3 = 0;
      while (iVar5 = iVar3, iVar4 = Height(in_RDX), iVar3 < iVar4) {
        memcpy(__dest + iVar5 * iVar2,(void *)((long)in_RCX + (long)(iVar5 * in_R8D)),(long)iVar2);
        iVar3 = iVar5 + 1;
      }
    }
  }
  return;
}

Assistant:

void ProcessCapture(const F &data, BaseFrameProcessor &base, const C &mointor, const unsigned char *startsrc, int srcrowstride)
    {
        ImageRect imageract;
        imageract.left = 0;
        imageract.top = 0;
        imageract.bottom = Height(mointor);
        imageract.right = Width(mointor);
        const auto sizeofimgbgra = static_cast<int>(sizeof(ImageBGRA));
        const auto startimgsrc = reinterpret_cast<const ImageBGRA *>(startsrc);
        auto dstrowstride = sizeofimgbgra * Width(mointor);
        if (data.OnNewFrame) { // each frame we still let the caller know if asked for
            auto wholeimg = CreateImage(imageract, srcrowstride, startimgsrc);
            wholeimg.isContiguous = dstrowstride == srcrowstride;
            data.OnNewFrame(wholeimg, mointor);
        }
        if (data.OnFrameChanged) { // difs are needed, which means that we must hold the last known image in memory for comparisons...
            if (base.FirstRun) {
                // first time through, just send the whole image
                auto wholeimg = CreateImage(imageract, srcrowstride, startimgsrc);
                wholeimg.isContiguous = dstrowstride == srcrowstride;
                data.OnFrameChanged(wholeimg, mointor);
                base.FirstRun = false;
            }
            else {
                // user wants difs, lets do it!
                auto newimg = CreateImage(imageract, srcrowstride, startimgsrc);
                auto oldimg = CreateImage(imageract, 0, reinterpret_cast<const ImageBGRA *>(base.ImageBuffer.get()));
                auto imgdifs = GetDifs(oldimg, newimg);

                for (auto &r : imgdifs) {
                    auto leftoffset = r.left * sizeofimgbgra;
                    auto thisstartsrc = startsrc + leftoffset + (r.top * srcrowstride);

                    auto difimg = CreateImage(r, srcrowstride, reinterpret_cast<const ImageBGRA *>(thisstartsrc));
                    difimg.isContiguous = false;
                    data.OnFrameChanged(difimg, mointor);
                }
            }
            auto startdst = base.ImageBuffer.get(); 
            assert(base.ImageBufferSize >= dstrowstride * Height(mointor));
            if (dstrowstride == srcrowstride) { // no need for multiple calls, there is no padding here 
                memcpy(startdst, startsrc, dstrowstride * Height(mointor));
            }
            else { 
                for (auto i = 0; i < Height(mointor); i++) {
                    memcpy(startdst + (i * dstrowstride), startsrc + (i * srcrowstride), dstrowstride);
                }
            }
        }
    }